

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O3

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:378:46)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:378:46)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  pointer *ppSVar1;
  ParseStream *pPVar2;
  SceneLoadingTutorialApplication *pSVar3;
  iterator __position;
  SceneGraphOperations local_14;
  
  pPVar2 = cin->ptr;
  if (pPVar2 != (ParseStream *)0x0) {
    (*(pPVar2->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(pPVar2);
  }
  pSVar3 = (this->f).this;
  __position._M_current =
       (pSVar3->sgop).
       super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pSVar3->sgop).
      super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
    ::_M_realloc_insert<embree::SceneLoadingTutorialApplication::SceneGraphOperations>
              (&pSVar3->sgop,__position,&local_14);
  }
  else {
    *__position._M_current = CONVERT_GRIDS_TO_QUADS;
    ppSVar1 = &(pSVar3->sgop).
               super__Vector_base<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  if (pPVar2 != (ParseStream *)0x0) {
    (*(pPVar2->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[3])(pPVar2);
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }